

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O3

GroupInfo __thiscall UnifiedRegex::RegexPattern::GetGroup(RegexPattern *this,int groupId)

{
  Matcher *pMVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  
  if (groupId == 0) {
LAB_00edeecc:
    bVar3 = true;
    if ((uint)((this->rep).unified.program.ptr)->numGroups <= (uint)groupId) goto LAB_00edeee4;
    lVar6 = *(long *)((long)&this->rep + 8);
LAB_00edef42:
    if ((uint)groupId < (uint)*(ushort *)(*(long *)(lVar6 + 0x10) + 0xc)) goto LAB_00edefa0;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    pMVar1 = (this->rep).unified.matcher.ptr;
    if ((pMVar1 == (Matcher *)0x0) || (((pMVar1->groupInfos).ptr)->length == 0xffffffff)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                         ,0x80,"(groupId == 0 || WasLastMatchSuccessful())",
                         "groupId == 0 || WasLastMatchSuccessful()");
      if (!bVar3) goto LAB_00edefb4;
      *puVar5 = 0;
    }
    if (-1 < groupId) goto LAB_00edeecc;
    bVar3 = false;
LAB_00edeee4:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                       ,0x81,"(groupId >= 0 && groupId < NumGroups())",
                       "groupId >= 0 && groupId < NumGroups()");
    if (!bVar4) goto LAB_00edefb4;
    *puVar5 = 0;
    lVar6 = *(long *)((long)&this->rep + 8);
    if (bVar3) goto LAB_00edef42;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar5 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                     ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                     "groupId >= 0 && groupId < program->numGroups");
  if (!bVar3) {
LAB_00edefb4:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
LAB_00edefa0:
  return *(GroupInfo *)(*(long *)(lVar6 + 0x18) + (long)groupId * 8);
}

Assistant:

GroupInfo RegexPattern::GetGroup(int groupId) const
    {
        Assert(groupId == 0 || WasLastMatchSuccessful());
        Assert(groupId >= 0 && groupId < NumGroups());
        return rep.unified.matcher->GetGroup(groupId);
    }